

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# representation.cpp
# Opt level: O0

void SituationToFen(Situation *situation,char *fen)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  char *in_RSI;
  int *in_RDI;
  char *fent;
  int space_count;
  int piece_id;
  int col;
  int row;
  char local_31;
  char *local_28;
  int local_20;
  int local_18;
  int local_14;
  
  local_28 = in_RSI;
  for (local_14 = 3; local_14 < 0xd; local_14 = local_14 + 1) {
    local_20 = 0;
    for (local_18 = 3; local_18 < 0xc; local_18 = local_18 + 1) {
      iVar2 = GetPosition(local_18,local_14);
      bVar1 = *(byte *)((long)in_RDI + (long)iVar2 + 4);
      uVar3 = (uint)bVar1;
      if (uVar3 == 0) {
        local_20 = local_20 + 1;
      }
      else {
        if (local_20 != 0) {
          *local_28 = (char)local_20 + '0';
          local_20 = 0;
          local_28 = local_28 + 1;
        }
        if ((bVar1 & 0x10) == 0) {
          *local_28 = FEN_OF_PIECE[1][(int)(uVar3 - 0x20)];
        }
        else {
          *local_28 = FEN_OF_PIECE[0][(int)(uVar3 - 0x10)];
        }
        local_28 = local_28 + 1;
      }
    }
    if (0 < local_20) {
      *local_28 = (char)local_20 + '0';
      local_28 = local_28 + 1;
    }
    *local_28 = '/';
    local_28 = local_28 + 1;
  }
  local_28[-1] = ' ';
  local_31 = 'w';
  if (*in_RDI != 0) {
    local_31 = 'b';
  }
  *local_28 = local_31;
  local_28[1] = '\0';
  return;
}

Assistant:

void SituationToFen(Situation & situation, char* fen){
    int row, col, piece_id, space_count;
    char *fent = fen;
    for(row = 3; row <= 12; row++){
        space_count = 0;
        for(col = 3; col <= 11; col ++){
            piece_id = situation.current_board[GetPosition(col, row)];
            if(piece_id != 0){
                if(space_count != 0){
                    *fent = space_count + '0';
                    space_count = 0;
                    fent ++;
                }
                if(piece_id & 16){
                    *fent = FEN_OF_PIECE[0][piece_id - 16];
                }
                else{
                    *fent = FEN_OF_PIECE[1][piece_id - 32];
                }
                fent ++;
            }
            else{
                space_count ++;
            }
        }
        if(space_count > 0){
            *fent = space_count + '0';
            fent ++;
        }
        *fent = '/';
        fent ++;
    }
    *(fent - 1) = ' ';
    *fent = (situation.current_player == RED ? 'w' : 'b');
    fent ++;
    *fent = '\0';
}